

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var Js::TypedArrayBase::EntryFilter(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *alloc;
  ImplicitCallFlags IVar1;
  int iVar2;
  uint32 uVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  BOOL BVar10;
  Attributes attributes;
  undefined4 *puVar11;
  TypedArrayBase *pTVar12;
  Var pvVar13;
  RecyclableObject *pRVar14;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  undefined4 extraout_var;
  JavascriptMethod p_Var15;
  uint64 uVar16;
  uint64 uVar17;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  Type *ppvVar18;
  ulong uVar19;
  uint32 index;
  CallInfo CVar20;
  uint index_00;
  int in_stack_00000010;
  undefined1 local_f8 [8];
  AutoTagNativeLibraryEntry __tag;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_c8;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_a8;
  CallInfo local_90;
  CallInfo callInfo_local;
  RecyclableObject *local_80;
  undefined1 local_70 [8];
  ArgumentReader args;
  
  pSVar4 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_90 = callInfo;
  ThreadContext::ProbeStack(pSVar4->threadContext,0xc00,pSVar4,(PVOID)0x0);
  if (in_stack_00000010 != local_90._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00d6bda3;
    *puVar11 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_70 = (undefined1  [8])local_90;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_70,&local_90);
  pSVar4 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_f8,function,local_90,
             L"[TypedArray].prototype.filter",&stack0x00000000);
  if (((ulong)local_90 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) goto LAB_00d6bda3;
    *puVar11 = 0;
  }
  pTVar12 = ValidateTypedArray((Arguments *)local_70,pSVar4,L"[TypedArray].prototype.filter");
  if (((ulong)local_70 & 0xfffffe) == 0) {
LAB_00d6bda5:
    JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec34,L"[TypedArray].prototype.filter");
  }
  callInfo_local._4_4_ = 0;
  callInfo_local._0_4_ = (pTVar12->super_ArrayBufferParent).super_ArrayObject.length;
  pvVar13 = Arguments::operator[]((Arguments *)local_70,1);
  bVar7 = JavascriptConversion::IsCallable(pvVar13);
  if (!bVar7) goto LAB_00d6bda5;
  pvVar13 = Arguments::operator[]((Arguments *)local_70,1);
  pRVar14 = VarTo<Js::RecyclableObject>(pvVar13);
  if ((local_70._0_4_ & 0xffffff) < 3) {
    local_80 = (((pSVar4->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    local_80 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_70,2);
  }
  __tag.entry.next = (Entry *)ScriptContext::GetTemporaryGuestAllocator(pSVar4,L"Runtime");
  alloc = &((TempGuestArenaAllocatorObject *)__tag.entry.next)->allocator;
  this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
         new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer = (Type)0x0;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_014f1568;
  this->length = 0;
  this->increment = 4;
  if (callInfo_local != (CallInfo)0x0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    CVar20 = (CallInfo)0x0;
    do {
      iVar9 = (*(pTVar12->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pTVar12,(ulong)CVar20 & 0xffffffff);
      pTVar5 = pSVar4->threadContext;
      bVar7 = pTVar5->reentrancySafeOrHandled;
      pTVar5->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar5);
      if (pSVar4->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var15 = RecyclableObject::GetEntryPoint(pRVar14);
      CheckIsExecutable(pRVar14,p_Var15);
      p_Var15 = RecyclableObject::GetEntryPoint(pRVar14);
      if (CVar20._0_4_ < 0) {
        args.super_Arguments.Values = (Type)(double)((ulong)CVar20 & 0xffffffff);
        uVar16 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values);
        bVar8 = NumberUtilities::IsNan((double)args.super_Arguments.Values);
        if (((bVar8) &&
            (uVar17 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values),
            uVar17 != 0xfff8000000000000)) &&
           (uVar17 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values),
           uVar17 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar8) goto LAB_00d6bda3;
          *puVar11 = 0;
        }
        uVar19 = uVar16 ^ 0xfffc000000000000;
      }
      else {
        uVar19 = (long)CVar20 + 0x1000000000000;
      }
      pvVar13 = (*p_Var15)(pRVar14,(CallInfo)pRVar14,0x2000004,0,0,0,0,0x2000004,local_80,
                           (void *)CONCAT44(extraout_var,iVar9),uVar19,pTVar12);
      pTVar5->reentrancySafeOrHandled = bVar7;
      BVar10 = JavascriptConversion::ToBoolean(pvVar13,pSVar4);
      if (BVar10 != 0) {
        JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(this,0);
        iVar2 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
        (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer[iVar2] =
             (void *)CONCAT44(extraout_var,iVar9);
        (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
             iVar2 + 1;
      }
      CVar20 = (CallInfo)((long)CVar20 + 1);
    } while (callInfo_local != CVar20);
  }
  uVar3 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  pvVar13 = Arguments::operator[]((Arguments *)local_70,0);
  defaultConstructor = GetDefaultConstructor(pvVar13,pSVar4);
  instanceObj = (JavascriptFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)pTVar12,defaultConstructor,pSVar4);
  bVar7 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x6dd,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar7) {
LAB_00d6bda3:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
  }
  pTVar5 = pSVar4->threadContext;
  local_a8.constructor = (RecyclableObject *)instanceObj;
  local_a8.captured = uVar3;
  local_a8.scriptContext = pSVar4;
  if (instanceObj == defaultConstructor) {
    bVar7 = pTVar5->reentrancySafeOrHandled;
    pTVar5->reentrancySafeOrHandled = true;
    pRVar14 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_a8);
    pTVar5->reentrancySafeOrHandled = bVar7;
    goto LAB_00d6bcc1;
  }
  local_c8._12_4_ = local_a8._12_4_;
  bVar7 = pTVar5->reentrancySafeOrHandled;
  pTVar5->reentrancySafeOrHandled = true;
  local_c8.constructor = (RecyclableObject *)instanceObj;
  local_c8.captured = uVar3;
  local_c8.scriptContext = pSVar4;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
  bVar8 = ThreadContext::HasNoSideEffect(pTVar5,(RecyclableObject *)instanceObj,attributes);
  if (bVar8) {
    pRVar14 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_c8);
    bVar8 = ThreadContext::IsOnStack(pRVar14);
LAB_00d6bc2c:
    if (bVar8 != false) {
      pTVar5->implicitCallFlags = pTVar5->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((pTVar5->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar14 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_c8);
      bVar8 = ThreadContext::IsOnStack(pRVar14);
      goto LAB_00d6bc2c;
    }
    IVar1 = pTVar5->implicitCallFlags;
    pRVar14 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_c8);
    pTVar5->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    pTVar5->implicitCallFlags = pTVar5->implicitCallFlags | ImplicitCall_Accessor;
    pRVar14 = (((((((((instanceObj->super_DynamicObject).super_RecyclableObject.type.ptr)->
                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
  }
  pTVar5->reentrancySafeOrHandled = bVar7;
LAB_00d6bcc1:
  pRVar14 = VarTo<Js::RecyclableObject>(pRVar14);
  bVar7 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRVar14);
  if (bVar7) {
    pTVar12 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar14);
  }
  else {
    pTVar12 = (TypedArrayBase *)0x0;
  }
  if (pTVar12 == (TypedArrayBase *)0x0) {
    if (uVar3 != 0) {
      index = 0;
      do {
        ppvVar18 = JsUtil::
                   List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this,index);
        JavascriptOperators::OP_SetElementI_UInt32
                  (pRVar14,index,*ppvVar18,pSVar4,PropertyOperation_ThrowIfNotExtensible);
        index = index + 1;
      } while (uVar3 != index);
    }
  }
  else if (uVar3 != 0) {
    index_00 = 0;
    do {
      ppvVar18 = JsUtil::
                 List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this,index_00);
      (*(pTVar12->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTVar12,(ulong)index_00,*ppvVar18);
      index_00 = index_00 + 1;
    } while (uVar3 != index_00);
  }
  ScriptContext::ReleaseTemporaryGuestAllocator
            (pSVar4,(TempGuestArenaAllocatorObject *)__tag.entry.next);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_f8);
  return pRVar14;
}

Assistant:

Var TypedArrayBase::EntryFilter(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.filter"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_filter);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.filter"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        Var element = nullptr;
        Var selected = nullptr;
        RecyclableObject* newObj = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            // Create a temporary list to hold the items selected by the callback function.
            // We will then iterate over this list and append those items into the object we will return.
            // We have to collect the items into this temporary list because we need to call the
            // new object constructor with a length of items and we don't know what length will be
            // until we know how many items we will collect.
            JsUtil::List<Var, ArenaAllocator>* tempList = JsUtil::List<Var, ArenaAllocator>::New(tempAlloc);

            for (uint32 k = 0; k < length; k++)
            {
                // We know that the TypedArray.HasItem will be true because k < length and we can skip the check in the TypedArray version of filter.
                element = typedArrayBase->DirectGetItem(k);

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    selected = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                    callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                    element,
                                    JavascriptNumber::ToVar(k, scriptContext),
                                    typedArrayBase);
                }
                END_SAFE_REENTRANT_CALL

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    tempList->Add(element);
                }
            }

            uint32 captured = tempList->Count();

            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            newObj = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(captured, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), captured, scriptContext);
            }));

            TypedArrayBase* newArr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            if (newArr)
            {
                // We are much more likely to have a TypedArray here than anything else

                for (uint32 i = 0; i < captured; i++)
                {
                    newArr->DirectSetItem(i, tempList->Item(i));
                }
            }
            else
            {
                for (uint32 i = 0; i < captured; i++)
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, i, tempList->Item(i), scriptContext, PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newObj;
    }